

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O2

size_t zzPowerMod_deep(size_t n,size_t m)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = zmCreate_deep(n * 8);
  sVar2 = qrPower_deep(n,m,sVar1);
  sVar1 = utilMax(2,sVar1,sVar2);
  return sVar1 + n * 8;
}

Assistant:

size_t zzPowerMod_deep(size_t n, size_t m)
{
	const size_t no = O_OF_W(n);
	const size_t r_deep = zmCreate_deep(no);
	return no + 
		utilMax(2,
			r_deep,
			qrPower_deep(n, m, r_deep));
}